

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwapIJ.c
# Opt level: O0

void swap_ij_case1(word *f,int totalVars,int i,int j)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  ulong local_198;
  word maskArray [45];
  int local_28;
  int shift;
  int n;
  int wordsNumber;
  int e;
  int j_local;
  int i_local;
  int totalVars_local;
  word *f_local;
  
  memcpy(&local_198,&DAT_00c2f460,0x168);
  iVar1 = (((i * 9 - i * i) + -2) / 2 + j) * 3;
  iVar2 = Kit_TruthWordNum_64bit(totalVars);
  maskArray[0x2c]._4_4_ = (1 << ((byte)j & 0x1f)) - (1 << ((byte)i & 0x1f));
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    bVar3 = (byte)maskArray[0x2c]._4_4_;
    f[local_28] = (f[local_28] & maskArray[(long)iVar1 + -1]) +
                  ((f[local_28] & maskArray[(long)(iVar1 + 1) + -1]) << (bVar3 & 0x3f)) +
                  ((f[local_28] & maskArray[(long)(iVar1 + 2) + -1]) >> (bVar3 & 0x3f));
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


void swap_ij_case1( word* f,int totalVars, int i, int j)
{
    int e,wordsNumber,n,shift;
    word maskArray[45]=
    {   ABC_CONST(0x9999999999999999), ABC_CONST(0x2222222222222222), ABC_CONST(0x4444444444444444) ,ABC_CONST(0xA5A5A5A5A5A5A5A5), ABC_CONST(0x0A0A0A0A0A0A0A0A), ABC_CONST(0x5050505050505050),
        ABC_CONST(0xAA55AA55AA55AA55), ABC_CONST(0x00AA00AA00AA00AA), ABC_CONST(0x5500550055005500) ,ABC_CONST(0xAAAA5555AAAA5555), ABC_CONST(0x0000AAAA0000AAAA), ABC_CONST(0x5555000055550000),
        ABC_CONST(0xAAAAAAAA55555555), ABC_CONST(0x00000000AAAAAAAA), ABC_CONST(0x5555555500000000) ,ABC_CONST(0xC3C3C3C3C3C3C3C3), ABC_CONST(0x0C0C0C0C0C0C0C0C), ABC_CONST(0x3030303030303030),
        ABC_CONST(0xCC33CC33CC33CC33), ABC_CONST(0x00CC00CC00CC00CC), ABC_CONST(0x3300330033003300) ,ABC_CONST(0xCCCC3333CCCC3333), ABC_CONST(0x0000CCCC0000CCCC), ABC_CONST(0x3333000033330000),
        ABC_CONST(0xCCCCCCCC33333333), ABC_CONST(0x00000000CCCCCCCC), ABC_CONST(0x3333333300000000) ,ABC_CONST(0xF00FF00FF00FF00F), ABC_CONST(0x00F000F000F000F0), ABC_CONST(0x0F000F000F000F00),
        ABC_CONST(0xF0F00F0FF0F00F0F), ABC_CONST(0x0000F0F00000F0F0), ABC_CONST(0x0F0F00000F0F0000) ,ABC_CONST(0xF0F0F0F00F0F0F0F), ABC_CONST(0x00000000F0F0F0F0), ABC_CONST(0x0F0F0F0F00000000),
        ABC_CONST(0xFF0000FFFF0000FF), ABC_CONST(0x0000FF000000FF00), ABC_CONST(0x00FF000000FF0000) ,ABC_CONST(0xFF00FF0000FF00FF), ABC_CONST(0x00000000FF00FF00), ABC_CONST(0x00FF00FF00000000),
        ABC_CONST(0xFFFF00000000FFFF), ABC_CONST(0x00000000FFFF0000), ABC_CONST(0x0000FFFF00000000)
    };
    e = 3*((9*i - i*i -2)/2 + j);          //  Exact formula for index in maskArray
    wordsNumber = Kit_TruthWordNum_64bit(totalVars);
    shift = (1<<j)-(1<<i);
    for(n = 0; n < wordsNumber; n++)
        f[n] = (f[n]&maskArray[e])+((f[n]&(maskArray[e+1]))<< shift)+((f[n]&(maskArray[e+2]))>> shift);
}